

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s_init_key(blake2s_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  undefined1 local_98 [8];
  uint8_t block [64];
  blake2s_param P [1];
  size_t keylen_local;
  void *key_local;
  size_t outlen_local;
  blake2s_state *S_local;
  
  if ((outlen == 0) || (0x20 < outlen)) {
    S_local._4_4_ = -1;
  }
  else if ((key == (void *)0x0) || ((keylen == 0 || (0x20 < keylen)))) {
    S_local._4_4_ = -1;
  }
  else {
    block[0x38] = (uint8_t)outlen;
    block[0x39] = (uint8_t)keylen;
    block[0x3a] = '\x01';
    block[0x3b] = '\x01';
    store32(block + 0x3c,0);
    store32(P,0);
    store16(&P[0].leaf_length,0);
    P[0].leaf_length._2_1_ = 0;
    P[0].leaf_length._3_1_ = 0;
    memset(&P[0].node_offset,0,8);
    memset(P[0].salt,0,8);
    iVar1 = blake2s_init_param(S,(blake2s_param *)(block + 0x38));
    if (iVar1 < 0) {
      S_local._4_4_ = -1;
    }
    else {
      memset(local_98,0,0x40);
      memcpy(local_98,key,keylen);
      blake2s_update(S,local_98,0x40);
      secure_zero_memory(local_98,0x40);
      S_local._4_4_ = 0;
    }
  }
  return S_local._4_4_;
}

Assistant:

int blake2s_init_key( blake2s_state *S, size_t outlen, const void *key, size_t keylen )
{
  blake2s_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = (uint8_t)keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2s_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2s_update( S, block, BLAKE2S_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}